

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw.c
# Opt level: O2

parasail_result_t *
parasail_nw_rowcol(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                  parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  parasail_result_t *ppVar6;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong size;
  int iVar11;
  ulong size_00;
  char *__format;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int *local_60;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar10 = "_s2";
  }
  else if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar10 = "s2Len";
  }
  else if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar10 = "open";
  }
  else if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar10 = "gap";
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar10 = "matrix";
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
LAB_004fa2c3:
      ppVar6 = parasail_result_new_rowcol1(_s1Len,s2Len);
      if (ppVar6 == (parasail_result_t *)0x0) {
        return (parasail_result_t *)0x0;
      }
      ppVar6->flag = ppVar6->flag | 0x1440101;
      size_00 = (ulong)(uint)s2Len;
      ptr = parasail_memalign_int(0x10,size_00);
      size = (ulong)(s2Len + 1);
      ptr_00 = parasail_memalign_int(0x10,size);
      ptr_01 = parasail_memalign_int(0x10,size);
      if (ptr_01 == (int *)0x0 || (ptr_00 == (int *)0x0 || ptr == (int *)0x0)) {
        return (parasail_result_t *)0x0;
      }
      if (matrix->type == 0) {
        local_60 = parasail_memalign_int(0x10,(long)_s1Len);
        uVar8 = 0;
        if (local_60 == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        uVar9 = 0;
        if (0 < _s1Len) {
          uVar9 = (ulong)(uint)_s1Len;
        }
        for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          local_60[uVar8] = matrix->mapper[(byte)_s1[uVar8]];
        }
      }
      else {
        local_60 = (int *)0x0;
      }
      piVar2 = matrix->mapper;
      for (uVar8 = 0; size_00 != uVar8; uVar8 = uVar8 + 1) {
        ptr[uVar8] = piVar2[(byte)_s2[uVar8]];
      }
      *ptr_00 = 0;
      *ptr_01 = -0x40000000;
      iVar4 = -open;
      for (uVar8 = 1; size != uVar8; uVar8 = uVar8 + 1) {
        ptr_00[uVar8] = iVar4;
        ptr_01[uVar8] = -0x40000000;
        iVar4 = iVar4 - gap;
      }
      uVar7 = 0;
      if (0 < _s1Len) {
        uVar7 = _s1Len;
      }
      for (uVar8 = 1; uVar8 != uVar7 + 1; uVar8 = uVar8 + 1) {
        iVar4 = matrix->size;
        lVar3 = uVar8 - 1;
        if (matrix->type == 0) {
          lVar3 = (long)local_60[uVar8 - 1];
        }
        piVar2 = matrix->matrix;
        iVar14 = *ptr_00;
        iVar11 = -((int)(uVar8 - 1) * gap + open);
        *ptr_00 = iVar11;
        iVar5 = -0x40000000;
        for (lVar13 = 0; size - 1 != lVar13; lVar13 = lVar13 + 1) {
          iVar1 = ptr_00[lVar13 + 1];
          iVar15 = iVar1 - open;
          iVar12 = ptr_01[lVar13 + 1] - gap;
          if (ptr_01[lVar13 + 1] - gap < iVar15) {
            iVar12 = iVar15;
          }
          ptr_01[lVar13 + 1] = iVar12;
          iVar15 = iVar5 - gap;
          iVar5 = iVar11 - open;
          if (iVar11 - open <= iVar15) {
            iVar5 = iVar15;
          }
          iVar11 = iVar14 + piVar2[iVar4 * lVar3 + (long)ptr[lVar13]];
          if (iVar11 <= iVar5) {
            iVar11 = iVar5;
          }
          if (iVar11 <= iVar12) {
            iVar11 = iVar12;
          }
          ptr_00[lVar13 + 1] = iVar11;
          iVar14 = iVar1;
        }
        ((ppVar6->field_4).rowcols)->score_col[uVar8 - 1] = iVar11;
      }
      for (uVar8 = 1; size != uVar8; uVar8 = uVar8 + 1) {
        ((ppVar6->field_4).rowcols)->score_row[uVar8 - 1] = ptr_00[uVar8];
      }
      ppVar6->score = ptr_00[size_00];
      ppVar6->end_query = _s1Len - 1;
      ppVar6->end_ref = s2Len + -1;
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      if (matrix->type == 0) {
        parasail_free(local_60);
        return ppVar6;
      }
      return ppVar6;
    }
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar10 = "_s1";
    }
    else {
      if (0 < _s1Len) goto LAB_004fa2c3;
      __format = "%s: %s must be > 0\n";
      pcVar10 = "_s1Len";
    }
  }
  fprintf(_stderr,__format,"parasail_nw_rowcol",pcVar10);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = -open -(j-1)*gap;
        F[j] = NEG_INF_32;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = -open - (i-1)*gap;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
#ifdef PARASAIL_TABLE
            result->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
#endif
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_col[i-1] = WH;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->rowcols->score_row[j-1] = H[j];
    }
#endif

    result->score = H[s2Len];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}